

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

QHttp2Stream * __thiscall QHttp2Connection::getStream(QHttp2Connection *this,quint32 streamID)

{
  QHttp2Stream *pQVar1;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> *in_RDI;
  long in_FS_OFFSET;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffffb0;
  QPointer<QHttp2Stream> *in_stack_ffffffffffffffb8;
  uint *key;
  uint local_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = local_30;
  QPointer<QHttp2Stream>::QPointer(in_stack_ffffffffffffffb0,in_RDI + 0x38);
  QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value(in_RDI,key,in_stack_ffffffffffffffb8);
  pQVar1 = QPointer<QHttp2Stream>::get((QPointer<QHttp2Stream> *)0x2b5df8);
  QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2b5e07);
  QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2b5e11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2Connection::getStream(quint32 streamID) const
{
    return m_streams.value(streamID, nullptr).get();
}